

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O2

IterateResult __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::iterate
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  uint uVar3;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *pTVar4;
  int iVar5;
  deUint32 dVar6;
  GLenum GVar7;
  undefined4 extraout_var;
  pointer p_Var9;
  int *piVar10;
  int *piVar11;
  ulong uVar12;
  TestError *this_00;
  MessageBuilder *pMVar13;
  NotSupportedError *this_01;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  GLuint GVar17;
  char *msg;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  allocator<char> local_1c9;
  long local_1c8;
  pointer local_1c0;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *local_1b8;
  undefined1 local_1b0 [384];
  long lVar8;
  
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == false) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b0,"Tessellation shader functionality not supported, skipping",
               &local_1c9);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)local_1b0);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  initTest(this);
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar5);
  (**(code **)(lVar8 + 0x5e0))(0x8c89);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glEnable(GL_RASTERIZER_DISCARD) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x531);
  (**(code **)(lVar8 + 0x5e0))(0x8d69);
  dVar6 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar6,"glEnable(GL_PRIMITIVE_RESTART_FIXED_INDEX) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x535);
  p_Var9 = (this->m_runs).
           super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = lVar8;
  local_1b8 = this;
  do {
    pTVar4 = local_1b8;
    if (p_Var9 == (local_1b8->m_runs).
                  super__Vector_base<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      tcu::TestContext::setTestResult
                ((local_1b8->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    local_1c0 = p_Var9;
    (**(code **)(lVar8 + 0xfd8))
              ((local_1b8->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,p_Var9->n_patch_vertices
              );
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x53e);
    (**(code **)(lVar8 + 0x1680))(local_1c0->po_id);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glUseProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x542);
    p_Var9 = local_1c0;
    GVar17 = 0;
    if (local_1c0->drawcall_is_indiced != false) {
      GVar17 = local_1c0->bo_indices_id;
    }
    (**(code **)(lVar8 + 0x40))(0x8893,GVar17);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"Could not update GL_ELEMENT_ARRAY_BUFFER binding",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x546);
    (**(code **)(lVar8 + 0x40))(0x8c8e,pTVar4->m_bo_id);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x54a);
    (**(code **)(lVar8 + 0x48))(0x8c8e,0,pTVar4->m_bo_id);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBindBufferBase() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x54d);
    lVar20 = (long)(int)(p_Var9->n_result_vertices * 0x14);
    (**(code **)(lVar8 + 0x150))(0x8c8e,lVar20,0,0x88e4);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBufferData() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x554);
    iVar5 = p_Var9->drawcall_count_multiplier * p_Var9->n_patch_vertices + p_Var9->n_restart_indices
    ;
    GVar7 = TessellationShaderUtils::getTFModeForPrimitiveMode(p_Var9->primitive_mode,false);
    (**(code **)(lVar8 + 0x30))(GVar7);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glBeginTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x55c);
    lVar8 = local_1c8;
    GVar17 = p_Var9->n_instances;
    GVar7 = (pTVar4->super_TestCaseBase).m_glExtTokens.PATCHES;
    if (p_Var9->drawcall_is_indiced == true) {
      if (GVar17 == 1) {
        (**(code **)(local_1c8 + 0x568))();
        dVar6 = (**(code **)(lVar8 + 0x800))();
        msg = "glDrawElements() failed";
        iVar5 = 0x56a;
      }
      else {
        (**(code **)(local_1c8 + 0x580))(GVar7,iVar5,0x1401,0);
        dVar6 = (**(code **)(lVar8 + 0x800))();
        msg = "glDrawElementsInstanced() failed";
        iVar5 = 0x565;
      }
    }
    else if (GVar17 == 1) {
      (**(code **)(local_1c8 + 0x538))();
      dVar6 = (**(code **)(lVar8 + 0x800))();
      msg = "glDrawArrays() failed";
      iVar5 = 0x579;
    }
    else {
      (**(code **)(local_1c8 + 0x548))(GVar7,0,iVar5,GVar17);
      dVar6 = (**(code **)(lVar8 + 0x800))();
      msg = "glDrawArraysInstanced() failed";
      iVar5 = 0x573;
    }
    glu::checkError(dVar6,msg,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,iVar5);
    (**(code **)(lVar8 + 0x638))();
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glEndTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x57e);
    piVar10 = (int *)(**(code **)(lVar8 + 0xd00))(0x8c8e,0,lVar20,1);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glMapBufferRange() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x584);
    uVar3 = local_1c0->n_result_vertices;
    uVar14 = (ulong)uVar3;
    piVar11 = piVar10;
    for (uVar18 = 0; uVar3 != uVar18; uVar18 = uVar18 + 1) {
      iVar16 = local_1c0->n_patch_vertices + -1;
      iVar5 = *piVar11;
      if (iVar5 != iVar16) {
        local_1b0._0_8_ =
             ((pTVar4->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Invalid gl_InvocationID value (");
        std::ostream::operator<<(poVar2,iVar5);
        std::operator<<((ostream *)poVar2,") was found for result coordinate at index ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<((ostream *)poVar2," instead of expected value (");
        std::ostream::operator<<(poVar2,iVar16);
        std::operator<<((ostream *)poVar2,").");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid gl_InvocationID value used in TC stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x5a0);
        goto LAB_00d23db9;
      }
      piVar11 = piVar11 + 5;
    }
    uVar18 = uVar3 / local_1c0->n_instances;
    for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
      uVar19 = uVar21 & 0xffffffff;
      do {
        uVar12 = uVar19;
        uVar15 = (uint)uVar12;
        uVar19 = (ulong)(uVar15 - uVar18);
      } while (uVar18 <= uVar15);
      uVar19 = (ulong)(uint)((int)uVar21 * 5);
      iVar5 = (int)(uVar12 / (((ulong)uVar3 / (ulong)local_1c0->drawcall_count_multiplier) /
                             (ulong)local_1c0->n_instances));
      if (piVar10[uVar19 + 2] != iVar5) {
        local_1b0._0_8_ =
             ((pTVar4->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Invalid gl_PrimitiveID value (");
        pMVar13 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,piVar10 + uVar19 + 2);
        poVar1 = &pMVar13->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        ") was used in TC stage instead of expected value (");
        std::ostream::operator<<(poVar1,iVar5);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        ")  as stored for result coordinate at index ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid gl_PrimitiveID value used in TC stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x5cb);
        goto LAB_00d23db9;
      }
      if (piVar10[uVar19 + 4] != iVar5) {
        local_1b0._0_8_ =
             ((pTVar4->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Invalid gl_PrimitiveID value (");
        pMVar13 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,piVar10 + uVar19 + 4);
        poVar1 = &pMVar13->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        ") was used in TE stage instead of expected value (");
        std::ostream::operator<<(poVar1,iVar5);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        ")  as stored for result coordinate at index ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid gl_PrimitiveID value used in TE stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x5db);
        goto LAB_00d23db9;
      }
    }
    uVar19 = 0;
    p_Var9 = local_1c0;
    for (uVar21 = 0; lVar8 = local_1c8, uVar21 < uVar14; uVar21 = uVar21 + 1) {
      iVar5 = p_Var9->n_patch_vertices;
      uVar12 = uVar19 & 0xffffffff;
      if (piVar10[uVar12 + 1] != iVar5) {
        local_1b0._0_8_ =
             ((local_1b8->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar2 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        std::operator<<((ostream *)poVar2,"Invalid gl_PatchVerticesIn value (");
        pMVar13 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,piVar10 + uVar12 + 1);
        poVar1 = &pMVar13->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        ") was used in TC stage instead of expected value (");
        std::ostream::operator<<(poVar1,iVar5);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        ")  as stored for result coordinate at index ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar2);
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid gl_PatchVerticesIn value used in TC stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x5fa);
LAB_00d23db9:
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if (piVar10[uVar12 + 3] != iVar5) {
        local_1b0._0_8_ =
             ((local_1b8->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::operator<<((ostream *)(local_1b0 + 8),"Invalid gl_PatchVerticesIn value (");
        pMVar13 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,piVar10 + uVar12 + 3);
        poVar1 = &pMVar13->m_str;
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        ") was used in TE stage instead of expected value (");
        std::ostream::operator<<(poVar1,iVar5);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                        ")  as stored for result coordinate at index ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,".");
        tcu::MessageBuilder::operator<<(pMVar13,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        uVar14 = (ulong)local_1c0->n_result_vertices;
        p_Var9 = local_1c0;
      }
      uVar19 = uVar19 + 5;
    }
    (**(code **)(local_1c8 + 0x1670))(0x8c8e);
    dVar6 = (**(code **)(lVar8 + 0x800))();
    glu::checkError(dVar6,"glUnmapBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x60e);
    p_Var9 = local_1c0 + 1;
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES test objects */
	initTest();

	/* Initialize tessellation shader utilities */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* We don't need rasterization for this test */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed.");

	/* Enable GL_PRIMITIVE_RESTART_FIXED_INDEX mode for indiced draw calls. */
	gl.enable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_PRIMITIVE_RESTART_FIXED_INDEX) failed.");

	/* Iterate through all test runs configured */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		/* Configure run-specific amount of vertices per patch */
		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, run.n_patch_vertices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname");

		/* Activate run-specific program object */
		gl.useProgram(run.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");

		/* Update GL_ELEMENT_ARRAY_BUFFER binding, depending on run properties */
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, (run.drawcall_is_indiced) ? run.bo_indices_id : 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not update GL_ELEMENT_ARRAY_BUFFER binding");

		/* Update transform feedback buffer bindings */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");

		/* Update the transform feedback buffer object storage. For each generated
		 * tessellated coordinate, TE stage will output 5 integers. */
		glw::GLint bo_size = static_cast<glw::GLint>(run.n_result_vertices * 5 /* ints */ * sizeof(int));

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

		/* Render the geometry */
		glw::GLint  drawcall_count = run.n_patch_vertices * run.drawcall_count_multiplier + run.n_restart_indices;
		glw::GLenum tf_mode =
			TessellationShaderUtils::getTFModeForPrimitiveMode(run.primitive_mode, false); /* is_point_mode_enabled */

		gl.beginTransformFeedback(tf_mode);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");
		{
			if (run.drawcall_is_indiced)
			{
				if (run.n_instances != 1)
				{
					gl.drawElementsInstanced(m_glExtTokens.PATCHES, drawcall_count, GL_UNSIGNED_BYTE,
											 DE_NULL, /* indices */
											 run.n_instances);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawElementsInstanced() failed");
				} /* if (run.n_instances != 0) */
				else
				{
					gl.drawElements(m_glExtTokens.PATCHES, drawcall_count, GL_UNSIGNED_BYTE, DE_NULL); /* indices */
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawElements() failed");
				}
			} /* if (run.drawcall_is_indiced) */
			else
			{
				if (run.n_instances != 1)
				{
					gl.drawArraysInstanced(m_glExtTokens.PATCHES, 0, /* first */
										   drawcall_count, run.n_instances);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArraysInstanced() failed");
				}
				else
				{
					gl.drawArrays(m_glExtTokens.PATCHES, 0, /* first */
								  drawcall_count);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");
				}
			}
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

		/* Map the result buffer object */
		const int* result_data = (const int*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
															   bo_size, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

		/* Verify gl_InvocationID values used in both stages were correct. In TE:
		 *
		 * te_tc_invocation_id = in_tc[gl_PatchVerticesIn-1].tc_invocation_id;
		 *
		 * In the list of varyings passed to glTransformFeedbackVaryings(),
		 * te_tc_invocation_id is the very first item, so no need to offset
		 * result_data when initializing result_traveller_ptr below.
		 */
		const unsigned int n_int_varyings_per_tess_coordinate = 5;
		const int*		   result_traveller_ptr				  = result_data;

		for (unsigned int n_coordinate = 0; n_coordinate < run.n_result_vertices;
			 ++n_coordinate, result_traveller_ptr += n_int_varyings_per_tess_coordinate)
		{
			const int expected_invocation_id = run.n_patch_vertices - 1;
			const int invocation_id_value	= *result_traveller_ptr;

			if (invocation_id_value != expected_invocation_id)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_InvocationID value (" << invocation_id_value
								   << ") "
									  "was found for result coordinate at index "
								   << n_coordinate << " "
													  "instead of expected value ("
								   << expected_invocation_id << ")." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_InvocationID value used in TC stage");
			}
		} /* for (all result coordinates) */

		/* Verify gl_PrimitiveID values used in both stages were correct. In TE:
		 *
		 * te_tc_primitive_id = in_tc[gl_PatchVerticesIn-1].tc_primitive_id;
		 * te_primitive_id    = gl_PrimitiveID;
		 *
		 * In the list of varyings passed to glTransformFeedbackVaryings(),
		 * te_tc_primitive_id is passed as 3rd string and te_primitive_id is located on
		 * 5th location.
		 */
		const unsigned int n_result_vertices_per_patch_vertex_batch =
			run.n_result_vertices / run.drawcall_count_multiplier / run.n_instances;
		const unsigned int n_result_vertices_per_instance = run.n_result_vertices / run.n_instances;

		for (unsigned int n_coordinate = 0; n_coordinate < run.n_result_vertices; ++n_coordinate)
		{
			unsigned int actual_n_coordinate = n_coordinate;

			/* Subsequent instances reset gl_PrimitiveID counter */
			while (actual_n_coordinate >= n_result_vertices_per_instance)
			{
				actual_n_coordinate -= n_result_vertices_per_instance;
			}

			/* Calculate expected gl_PrimitiveID value */
			const int expected_primitive_id = actual_n_coordinate / n_result_vertices_per_patch_vertex_batch;

			/* te_tc_primitive_id */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 2; /* as per comment */

			if (*result_traveller_ptr != expected_primitive_id)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PrimitiveID value (" << *result_traveller_ptr
								   << ") "
									  "was used in TC stage instead of expected value ("
								   << expected_primitive_id << ") "
															   " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PrimitiveID value used in TC stage");
			}

			/* te_primitive_id */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 4; /* as per comment */

			if (*result_traveller_ptr != expected_primitive_id)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PrimitiveID value (" << *result_traveller_ptr
								   << ") "
									  "was used in TE stage instead of expected value ("
								   << expected_primitive_id << ") "
															   " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PrimitiveID value used in TE stage");
			}
		} /* for (all result coordinates) */

		/* Verify gl_PatchVerticesIn values used in both stages were correct. In TE:
		 *
		 * te_tc_patch_vertices_in = in_tc[gl_PatchVerticesIn-1].tc_patch_vertices_in;
		 * te_patch_vertices_in    = gl_PatchVerticesIn;
		 *
		 * In the list of varyings passed to glTransformFeedbackVaryings(),
		 * te_tc_patch_vertices_in takes 2nd location and te_patch_vertices_in is
		 * located at 4th position.
		 *
		 **/
		for (unsigned int n_coordinate = 0; n_coordinate < run.n_result_vertices; ++n_coordinate)
		{
			const int expected_patch_vertices_in_value = run.n_patch_vertices;

			/* te_tc_patch_vertices_in */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 1; /* as per comment */

			if (*result_traveller_ptr != expected_patch_vertices_in_value)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PatchVerticesIn value ("
								   << *result_traveller_ptr << ") "
															   "was used in TC stage instead of expected value ("
								   << expected_patch_vertices_in_value << ") "
																		  " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PatchVerticesIn value used in TC stage");
			}

			/* te_patch_vertices_in */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 3; /* as per comment */

			if (*result_traveller_ptr != expected_patch_vertices_in_value)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PatchVerticesIn value ("
								   << *result_traveller_ptr << ") "
															   "was used in TE stage instead of expected value ("
								   << expected_patch_vertices_in_value << ") "
																		  " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;
			}
		} /* for (all result coordinates) */

		/* Unmap the buffer object - we're done with this iteration */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed");
	} /* for (all runs) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}